

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

bool __thiscall
HawkTracer::TCPServer::start
          (TCPServer *this,int port,OnClientConnected client_connected,void *user_data)

{
  bool bVar1;
  int iVar2;
  type local_68;
  thread local_50;
  undefined1 local_44 [8];
  sockaddr_in serveraddr;
  int optval;
  void *user_data_local;
  OnClientConnected client_connected_local;
  int port_local;
  TCPServer *this_local;
  
  unique0x100001b7 = user_data;
  bVar1 = is_running(this);
  if (bVar1) {
    stop(this);
  }
  iVar2 = socket(2,1,0);
  this->_sock_fd = iVar2;
  if (this->_sock_fd < 0) {
    this_local._7_1_ = false;
  }
  else {
    serveraddr.sin_zero[0] = '\x01';
    serveraddr.sin_zero[1] = '\0';
    serveraddr.sin_zero[2] = '\0';
    serveraddr.sin_zero[3] = '\0';
    iVar2 = setsockopt(this->_sock_fd,1,2,serveraddr.sin_zero,4);
    if (iVar2 == 0) {
      memset(local_44,0,0x10);
      local_44._0_2_ = 2;
      local_44._4_4_ = htonl(0);
      local_44._2_2_ = htons((uint16_t)port);
      iVar2 = bind(this->_sock_fd,(sockaddr *)local_44,0x10);
      if (iVar2 < 0) {
        stop(this);
        this_local._7_1_ = false;
      }
      else {
        iVar2 = listen(this->_sock_fd,5);
        if (iVar2 < 0) {
          stop(this);
          this_local._7_1_ = false;
        }
        else {
          local_68.user_data = stack0xffffffffffffffd0;
          local_68.this = this;
          local_68.client_connected = client_connected;
          std::thread::thread<HawkTracer::TCPServer::start(int,void(*)(int,void*),void*)::__0,,void>
                    (&local_50,&local_68);
          std::thread::operator=(&this->_accept_client_thread,&local_50);
          std::thread::~thread(&local_50);
          this_local._7_1_ = true;
        }
      }
    }
    else {
      stop(this);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TCPServer::start(int port, OnClientConnected client_connected, void* user_data)
{
    if (is_running())
    {
        stop();
    }
#ifdef _WIN32
    WSADATA wsaData;
    if (WSAStartup(MAKEWORD(2, 2), &wsaData) != 0)
    {
        return false;
    }
#endif
    _sock_fd = socket(AF_INET, SOCK_STREAM, 0);

    if (_sock_fd < 0)
    {
        return false;
    }

#ifndef _WIN32
    int optval = 1;
    if (setsockopt(_sock_fd, SOL_SOCKET, SO_REUSEADDR, (const void *)&optval , sizeof(int)) != 0)
    {
        stop();
        return false;
    }
#endif

    sockaddr_in serveraddr;
    memset((char *) &serveraddr, 0, sizeof(serveraddr));
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_addr.s_addr = htonl(INADDR_ANY);
    serveraddr.sin_port = htons((unsigned short)port);

    if (bind(_sock_fd, (struct sockaddr *) &serveraddr, sizeof(serveraddr)) < 0)
    {
        stop();
        return false;
    }

    if (listen(_sock_fd, 5) < 0)
    {
        stop();
        return false;
    }

    _accept_client_thread = std::thread([this, client_connected, user_data]
    {
        _run(client_connected, user_data);
    });

    return true;
}